

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O1

void __thiscall
Qentem::
HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
resize(HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
       *this,SizeT new_size)

{
  uint uVar1;
  uint uVar2;
  SizeT *pointer;
  SizeT SVar3;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar4;
  SizeT *pSVar5;
  SizeT *pSVar6;
  
  pointer = this->hashTable_;
  uVar1 = this->capacity_;
  uVar2 = this->index_;
  pHVar4 = allocate(this,new_size);
  this->index_ = 0;
  if ((ulong)uVar2 != 0) {
    pSVar5 = pointer + uVar1;
    pSVar6 = pSVar5 + (ulong)uVar2 * 0xc;
    do {
      if (pSVar5[4] != 0) {
        (pHVar4->Key).storage_ = *(char **)pSVar5;
        (pHVar4->Key).length_ = pSVar5[2];
        pSVar5[2] = 0;
        pSVar5[0] = 0;
        pSVar5[1] = 0;
        SVar3 = pSVar5[5];
        pHVar4->Hash = pSVar5[4];
        pHVar4->Next = SVar3;
        Value<char>::Value(&pHVar4->Value,(Value<char> *)(pSVar5 + 6));
        pHVar4 = pHVar4 + 1;
        this->index_ = this->index_ + 1;
      }
      pSVar5 = pSVar5 + 0xc;
    } while (pSVar5 < pSVar6);
  }
  if (pointer != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(pointer);
  }
  operator_delete(pointer);
  generateHash(this);
  return;
}

Assistant:

void resize(const SizeT new_size) {
        SizeT       *ht      = getHashTable();
        HItem       *item    = Storage();
        const HItem *end     = (item + Size());
        HItem       *storage = allocate(new_size);

        setSize(0);

        while (item < end) {
            if (item->Hash != 0) {
                Memory::Initialize(storage, Memory::Move(*item));
                ++storage;
                ++index_;
            }

            ++item;
        }

        Memory::Deallocate(ht);
        generateHash();
    }